

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusintegrator.cpp
# Opt level: O0

void huntAndDestroy(QObject *needle,ObjectTreeNode *haystack)

{
  bool bVar1;
  ObjectTreeNode *haystack_00;
  QObject *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  ObjectTreeNode *node;
  DataList *__range1;
  anon_class_1_0_00000001_for__M_pred isInactive;
  iterator __end1;
  iterator __begin1;
  QList<QDBusConnectionPrivate::ObjectTreeNode> *in_stack_ffffffffffffffb0;
  undefined4 local_28;
  undefined1 local_21;
  ObjectTreeNode *local_20;
  iterator local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  haystack_00 = (ObjectTreeNode *)(in_RSI + 0x40);
  local_10.i = (ObjectTreeNode *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QDBusConnectionPrivate::ObjectTreeNode>::begin(in_stack_ffffffffffffffb0);
  local_18.i = (ObjectTreeNode *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<QDBusConnectionPrivate::ObjectTreeNode>::end(in_stack_ffffffffffffffb0);
  while( true ) {
    local_20 = local_18.i;
    bVar1 = QList<QDBusConnectionPrivate::ObjectTreeNode>::iterator::operator!=(&local_10,local_18);
    if (!bVar1) break;
    QList<QDBusConnectionPrivate::ObjectTreeNode>::iterator::operator*(&local_10);
    huntAndDestroy(in_RSI,haystack_00);
    QList<QDBusConnectionPrivate::ObjectTreeNode>::iterator::operator++(&local_10);
  }
  local_21 = 0xaa;
  QList<QDBusConnectionPrivate::ObjectTreeNode>::
  removeIf<huntAndDestroy(QObject*,QDBusConnectionPrivate::ObjectTreeNode&)::__0>
            ((QList<QDBusConnectionPrivate::ObjectTreeNode> *)(in_RSI + 0x40));
  if (in_RDI == *(long *)(in_RSI + 0x30)) {
    *(undefined8 *)(in_RSI + 0x30) = 0;
    memset(&local_28,0,4);
    QFlags<QDBusConnection::RegisterOption>::QFlags
              ((QFlags<QDBusConnection::RegisterOption> *)0x164e77);
    *(undefined4 *)(in_RSI + 0x38) = local_28;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void huntAndDestroy(QObject *needle, QDBusConnectionPrivate::ObjectTreeNode &haystack)
{
    for (QDBusConnectionPrivate::ObjectTreeNode &node : haystack.children)
        huntAndDestroy(needle, node);

    auto isInactive = [](const QDBusConnectionPrivate::ObjectTreeNode &node) { return !node.isActive(); };
    haystack.children.removeIf(isInactive);

    if (needle == haystack.obj) {
        haystack.obj = nullptr;
        haystack.flags = {};
    }
}